

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  bool bVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  char *__filename;
  undefined4 *puVar16;
  uint *puVar17;
  long lVar18;
  long lVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  undefined7 in_register_00000081;
  Item *this_02;
  byte bVar21;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_250;
  uint local_24c;
  Item *local_248;
  undefined4 local_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint local_1d8 [3];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  cpp_dec_float<200U,_int,_void> local_1a0;
  uint local_120 [28];
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar21 = 0;
  if ((j | i) < 0) {
    return;
  }
  local_23c = (undefined4)CONCAT71(in_register_00000081,scale);
  this_02 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  local_248 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[j].idx;
  puVar13 = (uint *)val;
  puVar17 = local_120;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar17 = *puVar13;
    puVar13 = puVar13 + 1;
    puVar17 = puVar17 + 1;
  }
  iVar6 = (val->m_backend).exp;
  bVar1 = (val->m_backend).neg;
  local_1b8._0_4_ = (val->m_backend).fpclass;
  local_1b8._4_4_ = (val->m_backend).prec_elem;
  uStack_1b0 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_250 = j;
  local_24c = i;
  a = Tolerances::epsilon(this_00);
  puVar13 = local_120;
  pcVar14 = &local_1a0;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar14->data)._M_elems[0] = *puVar13;
    puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  local_1a0.exp = iVar6;
  local_1a0.neg = bVar1;
  local_1a0.fpclass = (fpclass_type)local_1b8;
  local_1a0.prec_elem = local_1b8._4_4_;
  if ((bVar1 != false) &&
     (local_1a0.data._M_elems[0] != 0 || (fpclass_type)local_1b8 != cpp_dec_float_finite)) {
    local_1a0.neg = (bool)(bVar1 ^ 1);
  }
  bVar1 = false;
  if (((fpclass_type)local_1b8 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_1c0._0_4_ = cpp_dec_float_finite;
    local_1c0._4_4_ = 0x1c;
    local_238 = (undefined1  [16])0x0;
    local_228 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_1f8 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8[0] = 0;
    local_1d8[1] = 0;
    stack0xfffffffffffffe30 = 0;
    uStack_1cb = 0;
    iStack_1c8 = 0;
    bStack_1c4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_238,a);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_1a0,(cpp_dec_float<200U,_int,_void> *)local_238);
    bVar1 = 0 < iVar6;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  uVar5 = local_24c;
  uVar4 = local_250;
  if (!bVar1) {
    pNVar3 = (this_02->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if (pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      return;
    }
    pcVar9 = (char *)(long)(this_02->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
    if ((long)pcVar9 < 1) {
      return;
    }
    lVar8 = 0;
    while (*(uint *)((long)(&pNVar3->val + 1) + lVar8) != local_250) {
      lVar8 = lVar8 + 0x84;
      if ((long)pcVar9 * 0x84 == lVar8) {
        return;
      }
    }
    pNVar20 = (local_248->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    if (pNVar20 ==
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      return;
    }
    lVar8 = (long)(local_248->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused;
    if (lVar8 < 1) {
      return;
    }
    lVar18 = 0;
    while (*(uint *)((long)(&pNVar20->val + 1) + lVar18) != local_24c) {
      lVar18 = lVar18 + 0x84;
      if (lVar8 * 0x84 == lVar18) {
        return;
      }
    }
    piVar7 = &pNVar3->idx;
    __filename = (char *)0x0;
    do {
      if (*piVar7 == local_250) goto LAB_004f55f1;
      __filename = __filename + 1;
      piVar7 = piVar7 + 0x21;
    } while (pcVar9 != __filename);
    __filename = (char *)0xffffffff;
LAB_004f55f1:
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_02,__filename);
    pNVar3 = (local_248->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    pcVar9 = (char *)0xffffffff;
    if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       (uVar10 = (ulong)(local_248->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, 0 < (long)uVar10)) {
      piVar7 = &pNVar3->idx;
      uVar11 = 0;
      do {
        if (*piVar7 == uVar5) {
          pcVar9 = (char *)(uVar11 & 0xffffffff);
          break;
        }
        uVar11 = uVar11 + 1;
        piVar7 = piVar7 + 0x21;
      } while (uVar10 != uVar11);
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_248,pcVar9);
    return;
  }
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  stack0xfffffffffffffe30 = 0;
  uStack_1cb = 0;
  local_1e8 = ZEXT816(0);
  local_1f8 = ZEXT816(0);
  local_208 = ZEXT816(0);
  local_218 = ZEXT816(0);
  local_228 = ZEXT816(0);
  local_238 = ZEXT816(0);
  if ((char)local_23c == '\0') {
    pnVar15 = val;
    puVar13 = (uint *)local_238;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar13 = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
    }
    iStack_1c8 = (val->m_backend).exp;
    bStack_1c4 = (val->m_backend).neg;
    local_1c0._0_4_ = (val->m_backend).fpclass;
    local_1c0._4_4_ = (val->m_backend).prec_elem;
  }
  else {
    pSVar2 = this->lp_scaler;
    pnVar15 = val;
    puVar13 = local_b0;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar13 = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
    }
    local_40 = (val->m_backend).exp;
    local_3c = (val->m_backend).neg;
    local_38._0_4_ = (val->m_backend).fpclass;
    local_38._4_4_ = (val->m_backend).prec_elem;
    (*pSVar2->_vptr_SPxScaler[0x2a])(&local_1a0,pSVar2,this,(ulong)local_24c,(ulong)local_250);
    pcVar14 = &local_1a0;
    puVar13 = (uint *)local_238;
    for (lVar8 = 0x1c; iStack_1c8 = local_1a0.exp, bStack_1c4 = local_1a0.neg,
        local_1c0._0_4_ = local_1a0.fpclass, local_1c0._4_4_ = local_1a0.prec_elem, lVar8 != 0;
        lVar8 = lVar8 + -1) {
      *puVar13 = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
    }
  }
  pNVar3 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (lVar8 = (long)(this_02->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused, 0 < lVar8)) {
    lVar18 = 0;
    do {
      if (*(uint *)((long)(&pNVar3->val + 1) + lVar18) == uVar4) {
        pNVar20 = (local_248->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if ((pNVar20 !=
             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0) &&
           (lVar18 = (long)(local_248->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused, 0 < lVar18)) {
          lVar12 = 0;
          goto LAB_004f5567;
        }
        break;
      }
      lVar18 = lVar18 + 0x84;
    } while (lVar8 * 0x84 != lVar18);
  }
  goto LAB_004f5581;
  while( true ) {
    lVar18 = lVar18 + 1;
    piVar7 = piVar7 + 0x21;
    if (lVar8 == lVar18) break;
LAB_004f5646:
    if (*piVar7 == uVar4) goto LAB_004f5660;
  }
  lVar18 = -1;
LAB_004f5660:
  puVar16 = (undefined4 *)local_238;
  pNVar20 = pNVar3 + lVar18;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pNVar20->val).m_backend.data._M_elems[0] = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar20 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  pNVar3[lVar18].val.m_backend.exp = iStack_1c8;
  pNVar3[lVar18].val.m_backend.neg = bStack_1c4;
  pNVar3[lVar18].val.m_backend.fpclass = (fpclass_type)local_1c0;
  pNVar3[lVar18].val.m_backend.prec_elem = local_1c0._4_4_;
  pNVar3 = (local_248->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  lVar18 = -1;
  lVar8 = lVar18;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (lVar12 = (long)(local_248->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, 0 < lVar12)) {
    piVar7 = &pNVar3->idx;
    lVar19 = 0;
    do {
      lVar8 = lVar19;
      if (*piVar7 == local_24c) break;
      lVar19 = lVar19 + 1;
      piVar7 = piVar7 + 0x21;
      lVar8 = lVar18;
    } while (lVar12 != lVar19);
  }
  puVar16 = (undefined4 *)local_238;
  pNVar20 = pNVar3 + lVar8;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pNVar20->val).m_backend.data._M_elems[0] = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar20 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  pNVar3[lVar8].val.m_backend.exp = iStack_1c8;
  pNVar3[lVar8].val.m_backend.neg = bStack_1c4;
  pNVar3[lVar8].val.m_backend.fpclass = (fpclass_type)local_1c0;
  pNVar3[lVar8].val.m_backend.prec_elem = local_1c0._4_4_;
  return;
  while (lVar12 = lVar12 + 0x84, lVar18 * 0x84 != lVar12) {
LAB_004f5567:
    if (*(uint *)((long)(&pNVar20->val + 1) + lVar12) == local_24c) {
      piVar7 = &pNVar3->idx;
      lVar18 = 0;
      goto LAB_004f5646;
    }
  }
LAB_004f5581:
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add2(&this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ,local_24c,1,(int *)&local_250,
         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_238);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add2(&this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ,local_250,1,(int *)&local_24c,
         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_238);
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }